

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

uint32_t get_meta_pos(lyd_meta *meta)

{
  uint32_t uVar1;
  lyd_meta *plVar2;
  bool bVar3;
  
  plVar2 = meta->parent->meta;
  bVar3 = plVar2 != (lyd_meta *)0x0;
  uVar1 = 0;
  if (plVar2 != meta && bVar3) {
    uVar1 = 0;
    do {
      uVar1 = uVar1 + 1;
      plVar2 = plVar2->next;
      bVar3 = plVar2 != (lyd_meta *)0x0;
      if (plVar2 == (lyd_meta *)0x0) break;
    } while (plVar2 != meta);
  }
  if (bVar3) {
    return uVar1;
  }
  __assert_fail("meta2",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                0x634,"uint32_t get_meta_pos(struct lyd_meta *)");
}

Assistant:

static uint32_t
get_meta_pos(struct lyd_meta *meta)
{
    uint32_t pos = 0;
    struct lyd_meta *meta2;

    for (meta2 = meta->parent->meta; meta2 && (meta2 != meta); meta2 = meta2->next) {
        ++pos;
    }

    assert(meta2);
    return pos;
}